

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::insert
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this,
          vector3_base<int> *item,range r)

{
  undefined8 uVar1;
  int iVar2;
  anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 aVar3;
  bool bVar4;
  int iVar5;
  vector3_base<int> *pvVar6;
  vector3_base<int> *pvVar7;
  undefined8 *in_RSI;
  array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int index;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_38;
  int local_1c;
  plain_range<vector3_base<int>_> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = plain_range<vector3_base<int>_>::empty(&local_18);
  if (bVar4) {
    local_1c = add(in_RDI,(vector3_base<int> *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    pvVar6 = plain_range<vector3_base<int>_>::front((plain_range<vector3_base<int>_> *)in_RDI);
    iVar5 = (int)(((long)pvVar6 - (long)in_RDI->list) / 0xc);
    incsize(in_RDI);
    size(in_RDI);
    set_size(in_RDI,in_stack_ffffffffffffffbc);
    iVar2 = in_RDI->num_elements;
    while (local_38 = iVar2 + -1, iVar5 < local_38) {
      pvVar7 = in_RDI->list + (iVar2 + -2);
      pvVar6 = in_RDI->list + local_38;
      aVar3 = pvVar7->field_1;
      pvVar6->field_0 = pvVar7->field_0;
      pvVar6->field_1 = aVar3;
      pvVar6->field_2 = pvVar7->field_2;
      iVar2 = local_38;
    }
    pvVar6 = in_RDI->list + iVar5;
    uVar1 = *in_RSI;
    pvVar6->field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<int>_1)(int)uVar1;
    pvVar6->field_1 = (anon_union_4_3_4e90b0cd_for_vector3_base<int>_3)(int)((ulong)uVar1 >> 0x20);
    pvVar6->field_2 = *(anon_union_4_4_d826a04f_for_vector3_base<int>_5 *)(in_RSI + 1);
    local_1c = in_RDI->num_elements + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}